

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  Ivy_Obj_t *pObj_00;
  int iVar2;
  Vec_Ptr_t *vArray;
  void **ppvVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x183,"void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x184,"void Ivy_ObjUpdateLevel_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  vArray = (Vec_Ptr_t *)malloc(0x10);
  vArray->nCap = 10;
  vArray->nSize = 0;
  ppvVar3 = (void **)malloc(0x50);
  vArray->pArray = ppvVar3;
  Ivy_ObjCollectFanouts(p,pObj,vArray);
  iVar2 = vArray->nSize;
  if (0 < iVar2) {
    lVar7 = 0;
    do {
      ppvVar3 = vArray->pArray;
      pObj_00 = (Ivy_Obj_t *)ppvVar3[lVar7];
      if (pObj_00 == (Ivy_Obj_t *)0x0) goto LAB_007fcde1;
      uVar1 = *(uint *)&pObj_00->field_0x8;
      uVar4 = uVar1 & 0xf;
      if ((uVar4 != 2) && (uVar4 != 4)) {
        uVar5 = (ulong)pObj_00->pFanin0 & 0xfffffffffffffffe;
        uVar6 = (ulong)pObj_00->pFanin1 & 0xfffffffffffffffe;
        if (*(uint *)(uVar6 + 8) >> 0xb < *(uint *)(uVar5 + 8) >> 0xb) {
          uVar6 = uVar5;
        }
        uVar4 = (*(uint *)(uVar6 + 8) >> 0xb) + (uint)(uVar4 == 6) + 1;
        if (uVar1 >> 0xb != uVar4) {
          *(uint *)&pObj_00->field_0x8 = uVar1 & 0x7ff | uVar4 * 0x800;
          Ivy_ObjUpdateLevel_rec(p,pObj_00);
          iVar2 = vArray->nSize;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar2);
  }
  ppvVar3 = vArray->pArray;
  if (ppvVar3 != (void **)0x0) {
LAB_007fcde1:
    free(ppvVar3);
  }
  free(vArray);
  return;
}

Assistant:

void Ivy_ObjUpdateLevel_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanout;
    Vec_Ptr_t * vFanouts;
    int i, LevelNew;
    assert( p->fFanout );
    assert( Ivy_ObjIsNode(pObj) );
    vFanouts = Vec_PtrAlloc( 10 );
    Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
    {
        if ( Ivy_ObjIsCo(pFanout) )
        {
//            assert( (int)Ivy_ObjFanin0(pFanout)->Level <= p->nLevelMax );
            continue;
        }
        LevelNew = Ivy_ObjLevelNew( pFanout );
        if ( (int)pFanout->Level == LevelNew )
            continue;
        pFanout->Level = LevelNew;
        Ivy_ObjUpdateLevel_rec( p, pFanout );
    }
    Vec_PtrFree( vFanouts );
}